

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O1

int __thiscall ncnn::Tile::forward(Tile *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  size_t sVar7;
  int *piVar8;
  size_t sVar9;
  void *pvVar10;
  size_t __n;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  Allocator *pAVar18;
  uint uVar19;
  void *pvVar20;
  uint uVar21;
  int iVar22;
  size_t __n_00;
  long lVar23;
  uint uVar24;
  ulong local_68;
  
  iVar12 = bottom_blob->dims;
  iVar1 = (this->repeats).w;
  puVar6 = (uint *)(this->repeats).data;
  if ((puVar6 == (uint *)0x0) || ((long)(this->repeats).c * (this->repeats).cstep == 0)) {
    uVar21 = 1;
    switch(iVar12) {
    case 1:
      uVar19 = 1;
      uVar16 = 1;
      uVar17 = this->tiles;
      break;
    case 2:
      uVar16 = 1;
      if (this->axis == 0) {
        uVar16 = this->tiles;
      }
      uVar17 = this->tiles;
      if (this->axis != 1) {
        uVar17 = 1;
      }
      uVar19 = 1;
      break;
    case 3:
      iVar2 = this->axis;
      uVar17 = this->tiles;
      uVar21 = 1;
      if (iVar2 == 0) {
        uVar21 = uVar17;
      }
      uVar16 = 1;
      if (iVar2 == 1) {
        uVar16 = uVar17;
      }
      uVar19 = 1;
      if (iVar2 != 2) {
        uVar17 = 1;
      }
      break;
    case 4:
      iVar2 = this->axis;
      uVar5 = this->tiles;
      uVar21 = 1;
      if (iVar2 == 0) {
        uVar21 = uVar5;
      }
      uVar19 = 1;
      if (iVar2 == 1) {
        uVar19 = uVar5;
      }
      uVar16 = 1;
      if (iVar2 == 2) {
        uVar16 = uVar5;
      }
      uVar17 = 1;
      if (iVar2 == 3) {
        uVar17 = uVar5;
      }
      break;
    default:
      uVar19 = 1;
      uVar16 = 1;
      uVar17 = 1;
    }
  }
  else {
    uVar16 = 1;
    uVar17 = 1;
    if (iVar1 == 1) {
      uVar17 = *puVar6;
    }
    if (iVar1 == 2) {
      uVar16 = *puVar6;
      uVar17 = puVar6[1];
    }
    uVar21 = 1;
    uVar19 = 1;
    if (iVar1 == 3) {
      uVar16 = puVar6[1];
      uVar17 = puVar6[2];
      uVar21 = *puVar6;
      uVar19 = 1;
      if (iVar12 == 4) {
        uVar21 = 1;
        uVar19 = *puVar6;
      }
    }
    if (iVar1 == 4) {
      uVar21 = *puVar6;
      uVar19 = puVar6[1];
      uVar16 = puVar6[2];
      uVar17 = puVar6[3];
    }
  }
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  iVar4 = bottom_blob->d;
  lVar15 = (long)iVar4;
  uVar5 = bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar22 = iVar1;
  if (iVar1 < iVar12) {
    iVar22 = iVar12;
  }
  uVar24 = uVar5;
  iVar11 = iVar4;
  if ((((uVar17 == 1) || (uVar16 != 1)) || (uVar19 != 1)) || (uVar21 != 1)) {
    if (((uVar16 == 1) || (uVar19 != 1)) || (uVar21 != 1)) {
      if ((uVar19 == 1) && (uVar21 != 1)) {
        if (iVar22 != 4) {
          if (iVar22 != 3) goto switchD_003ab355_default;
LAB_003ab3e1:
          pAVar18 = opt->blob_allocator;
          uVar24 = uVar5 * uVar21;
          iVar12 = iVar3 * uVar16;
          goto LAB_003ab547;
        }
        pAVar18 = opt->blob_allocator;
        iVar12 = iVar3 * uVar16;
        uVar24 = uVar5 * uVar21;
      }
      else {
        if ((uVar19 == 1) || (uVar21 == 1)) {
          if (iVar12 == iVar1 || iVar1 == 0) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar8 = bottom_blob->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + 1;
              UNLOCK();
            }
            piVar8 = top_blob->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar8 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar8;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar12 = bottom_blob->w;
            iVar1 = bottom_blob->h;
            iVar2 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar12;
            top_blob->h = iVar1;
            top_blob->d = iVar2;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
            return 0;
          }
          if (iVar22 != 4) {
            if (iVar22 != 3) goto LAB_003ab399;
            goto LAB_003ab3e1;
          }
        }
        else if (iVar22 != 4) goto switchD_003ab355_default;
        pAVar18 = opt->blob_allocator;
        iVar11 = iVar4 * uVar19;
        iVar12 = iVar3 * uVar16;
        uVar24 = uVar5 * uVar21;
      }
    }
    else {
      if (iVar22 != 4) {
        if (iVar22 == 3) {
          pAVar18 = opt->blob_allocator;
          iVar12 = iVar3 * uVar16;
          goto LAB_003ab547;
        }
LAB_003ab399:
        if (iVar22 != 2) goto switchD_003ab355_default;
        pAVar18 = opt->blob_allocator;
        iVar12 = iVar3 * uVar16;
        goto LAB_003ab4b6;
      }
      pAVar18 = opt->blob_allocator;
      iVar12 = iVar3 * uVar16;
    }
LAB_003ab5a9:
    Mat::create(top_blob,iVar2 * uVar17,iVar12,iVar11,uVar24,sVar7,pAVar18);
  }
  else {
    switch(iVar22) {
    case 1:
      Mat::create(top_blob,iVar2 * uVar17,sVar7,opt->blob_allocator);
      break;
    case 2:
      pAVar18 = opt->blob_allocator;
      iVar12 = iVar3;
LAB_003ab4b6:
      Mat::create(top_blob,iVar2 * uVar17,iVar12,sVar7,pAVar18);
      break;
    case 3:
      pAVar18 = opt->blob_allocator;
      iVar12 = iVar3;
LAB_003ab547:
      Mat::create(top_blob,iVar2 * uVar17,iVar12,uVar24,sVar7,pAVar18);
      break;
    case 4:
      pAVar18 = opt->blob_allocator;
      iVar12 = iVar3;
      goto LAB_003ab5a9;
    }
  }
switchD_003ab355_default:
  iVar12 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar5) {
      __n = (long)(int)(iVar2 * uVar17 * iVar3) * 4;
      __n_00 = (long)(int)(iVar4 * iVar3 * iVar2 * uVar16 * uVar17) * 4;
      local_68 = 0;
      do {
        if (0 < iVar4) {
          lVar13 = 0;
          do {
            if (0 < iVar3) {
              lVar23 = 0;
              do {
                if (0 < (int)uVar17) {
                  sVar7 = bottom_blob->cstep;
                  sVar9 = bottom_blob->elemsize;
                  pvVar10 = bottom_blob->data;
                  iVar12 = bottom_blob->h;
                  lVar14 = (long)bottom_blob->w * sVar9;
                  pvVar20 = (void *)(((top_blob->h * lVar13 + lVar23) * (long)top_blob->w +
                                     top_blob->cstep * local_68) * top_blob->elemsize +
                                    (long)top_blob->data);
                  uVar24 = uVar17;
                  do {
                    memcpy(pvVar20,(void *)((long)pvVar10 +
                                           lVar14 * lVar23 + iVar12 * lVar13 * lVar14 +
                                           sVar7 * local_68 * sVar9),(long)iVar2 * 4);
                    pvVar20 = (void *)((long)pvVar20 + (long)iVar2 * 4);
                    uVar24 = uVar24 - 1;
                  } while (uVar24 != 0);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 != iVar3);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar15);
        }
        if (0 < iVar4) {
          lVar13 = 0;
          do {
            if (1 < (int)uVar16) {
              iVar12 = top_blob->w;
              iVar1 = top_blob->h;
              sVar7 = top_blob->cstep;
              sVar9 = top_blob->elemsize;
              pvVar10 = top_blob->data;
              pvVar20 = (void *)(((top_blob->h * lVar13 + (long)iVar3) * (long)top_blob->w +
                                 top_blob->cstep * local_68) * top_blob->elemsize +
                                (long)top_blob->data);
              iVar22 = uVar16 - 1;
              do {
                memcpy(pvVar20,(void *)((long)pvVar10 +
                                       (long)iVar1 * sVar9 * iVar12 * lVar13 +
                                       sVar7 * local_68 * sVar9),__n);
                pvVar20 = (void *)((long)pvVar20 + __n);
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar15);
        }
        if (1 < (int)uVar19) {
          sVar7 = top_blob->cstep;
          sVar9 = top_blob->elemsize;
          pvVar10 = top_blob->data;
          pvVar20 = (void *)((top_blob->cstep * local_68 + top_blob->w * lVar15 * (long)top_blob->h)
                             * top_blob->elemsize + (long)top_blob->data);
          iVar12 = uVar19 - 1;
          do {
            memcpy(pvVar20,(void *)(sVar7 * local_68 * sVar9 + (long)pvVar10),__n_00);
            pvVar20 = (void *)((long)pvVar20 + __n_00);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        local_68 = local_68 + 1;
      } while (local_68 != uVar5);
    }
    iVar12 = 0;
    if (1 < (int)uVar21) {
      lVar13 = (ulong)uVar21 - 1;
      lVar15 = (long)(int)uVar5;
      do {
        memcpy((void *)(top_blob->cstep * lVar15 * top_blob->elemsize + (long)top_blob->data),
               top_blob->data,top_blob->cstep * (long)(int)uVar5 * 4);
        lVar15 = lVar15 + (int)uVar5;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
  }
  return iVar12;
}

Assistant:

int Tile::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int repeat_w = 1;
    int repeat_h = 1;
    int repeat_d = 1;
    int repeat_c = 1;

    const int repeats_num = repeats.w;

    if (repeats.empty())
    {
        if (dims == 1) // axis == 0
        {
            repeat_w = tiles;
        }
        else if (dims == 2)
        {
            if (axis == 0) repeat_h = tiles;
            if (axis == 1) repeat_w = tiles;
        }
        else if (dims == 3)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_h = tiles;
            if (axis == 2) repeat_w = tiles;
        }
        else if (dims == 4)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_d = tiles;
            if (axis == 2) repeat_h = tiles;
            if (axis == 3) repeat_w = tiles;
        }
    }
    else
    {
        // numpy style tile
        const int* repeats_ptr = repeats;

        if (repeats_num == 1)
        {
            repeat_w = repeats_ptr[0];
        }
        if (repeats_num == 2)
        {
            repeat_h = repeats_ptr[0];
            repeat_w = repeats_ptr[1];
        }
        if (repeats_num == 3)
        {
            if (dims == 4)
            {
                repeat_d = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
            else
            {
                repeat_c = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
        }
        if (repeats_num == 4)
        {
            repeat_c = repeats_ptr[0];
            repeat_d = repeats_ptr[1];
            repeat_h = repeats_ptr[2];
            repeat_w = repeats_ptr[3];
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int outdims = std::max(dims, repeats_num);
    if (repeat_w != 1 && repeat_h == 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 1)
            top_blob.create(w * repeat_w, elemsize, opt.blob_allocator);
        if (outdims == 2)
            top_blob.create(w * repeat_w, h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_h != 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_d == 1 && repeat_c != 1)
    {
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else if (repeat_d != 1 && repeat_c != 1)
    {
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else // all ones
    {
        if (repeats_num == 0 || dims == repeats_num)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        // repeat 0-w
        for (int z = 0; z < d; z++)
        {
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.channel(q).depth(z).row(y);
                float* outptr = top_blob.channel(q).depth(z).row(y);

                for (int p = 0; p < repeat_w; p++)
                {
                    memcpy(outptr, ptr, w * sizeof(float));
                    outptr += w;
                }
            }
        }

        // repeat 1-h
        for (int z = 0; z < d; z++)
        {
            const float* ptr = top_blob.channel(q).depth(z);
            float* outptr = top_blob.channel(q).depth(z).row(h);

            const int size = w * repeat_w * h;
            for (int p = 1; p < repeat_h; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }

        // repeat 1-d
        {
            const float* ptr = top_blob.channel(q);
            float* outptr = top_blob.channel(q).depth(d);

            const int size = w * repeat_w * h * repeat_h * d;
            for (int p = 1; p < repeat_d; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }
    }

    // repeat 1-c
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 1; p < repeat_c; p++)
    {
        const float* ptr = top_blob.channel_range(0, channels);
        float* outptr = top_blob.channel_range(p * channels, channels);

        memcpy(outptr, ptr, top_blob.cstep * channels * sizeof(float));
    }

    return 0;
}